

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QString * toStringTextDate(QDate date)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RSI;
  void *pvVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1Char sp;
  YearMonthDay parts;
  QCalendar cal;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
  *in_stack_fffffffffffffe18;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
  *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  QDate *in_stack_fffffffffffffe30;
  undefined1 *puVar4;
  QLocale *this;
  QDate date_00;
  FormatType in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  QString *locale;
  QDate in_stack_fffffffffffffe68;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined1 local_158 [8];
  undefined1 local_150 [271];
  QLatin1Char local_41;
  YearMonthDay local_40;
  undefined8 local_30;
  undefined1 *local_28;
  uint local_20;
  QLocale local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  date_00.jd = (qint64)in_RDI;
  locale = in_RDI;
  local_10 = in_RSI;
  bVar1 = QDate::isValid(in_stack_fffffffffffffe30);
  if (bVar1) {
    puVar4 = &DAT_aaaaaaaaaaaaaaaa;
    local_18.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    this = &local_18;
    QCalendar::QCalendar((QCalendar *)in_stack_fffffffffffffe20);
    local_20 = -0x55555556;
    local_30 = local_10;
    local_28 = puVar4;
    local_40 = QCalendar::partsFromDate((QCalendar *)in_RDI,in_stack_fffffffffffffe68);
    local_28 = (undefined1 *)local_40._0_8_;
    local_20 = local_40.day;
    bVar1 = QCalendar::YearMonthDay::isValid((YearMonthDay *)&local_28);
    if (bVar1) {
      local_41.ch = -0x56;
      pvVar3 = (void *)0x20;
      QLatin1Char::QLatin1Char(&local_41,' ');
      QLocale::c(local_158,pvVar3);
      local_160 = local_10;
      iVar2 = QCalendar::dayOfWeek((QCalendar *)in_RDI,date_00);
      QLocale::dayName(this,(int)((ulong)puVar4 >> 0x20),(FormatType)puVar4);
      puVar4 = local_150;
      operator+((QString *)CONCAT44(iVar2,in_stack_fffffffffffffe28),
                (QLatin1Char *)in_stack_fffffffffffffe20);
      QLocale::c(local_180,puVar4);
      QCalendar::monthName
                ((QCalendar *)in_stack_fffffffffffffe68.jd,(QLocale *)locale,
                 in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      operator+((QStringBuilder<QString,_const_QLatin1Char_&> *)
                CONCAT44(iVar2,in_stack_fffffffffffffe28),(QString *)in_stack_fffffffffffffe20);
      operator+((QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> *)
                CONCAT44(iVar2,in_stack_fffffffffffffe28),(QLatin1Char *)in_stack_fffffffffffffe20);
      QString::asprintf((char **)&stack0xfffffffffffffe68,"%d %04d",(ulong)local_20,
                        (ulong)local_28 & 0xffffffff);
      operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>
                 *)CONCAT44(iVar2,in_stack_fffffffffffffe28),(QString *)in_stack_fffffffffffffe20);
      QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe18);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::~QStringBuilder(in_stack_fffffffffffffe20);
      QString::~QString((QString *)0x568a9e);
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>
                         *)0x568aab);
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> *)
                 in_stack_fffffffffffffe20);
      QString::~QString((QString *)0x568ac2);
      QLocale::~QLocale((QLocale *)0x568acc);
      QStringBuilder<QString,_const_QLatin1Char_&>::~QStringBuilder
                ((QStringBuilder<QString,_const_QLatin1Char_&> *)0x568ad9);
      QString::~QString((QString *)0x568ae6);
      QLocale::~QLocale((QLocale *)0x568af3);
      goto LAB_00568c30;
    }
  }
  QString::QString((QString *)0x568c30);
LAB_00568c30:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)date_00.jd;
}

Assistant:

static QString toStringTextDate(QDate date)
{
    if (date.isValid()) {
        QCalendar cal; // Always Gregorian
        const auto parts = cal.partsFromDate(date);
        if (parts.isValid()) {
            const QLatin1Char sp(' ');
            return QLocale::c().dayName(cal.dayOfWeek(date), QLocale::ShortFormat) + sp
                + cal.monthName(QLocale::c(), parts.month, parts.year, QLocale::ShortFormat)
                // Documented to use 4-digit year
                + sp + QString::asprintf("%d %04d", parts.day, parts.year);
        }
    }
    return QString();
}